

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O2

void * monitoring_thread_loop(void *arg)

{
  kqueue_head kVar1;
  uint *puVar2;
  thread_exit_state tVar3;
  int iVar4;
  long lVar5;
  int *__ptr;
  kqueue *pkVar6;
  pthread_t __th;
  void *extraout_RAX;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  __pthread_unwind_buf_t *arg_00;
  __pthread_unwind_buf_t *arg_01;
  size_t __nmemb;
  __pthread_unwind_buf_t __cancel_buf;
  sigset_t monitoring_sig_set;
  siginfo_t info;
  
  arg_00 = &__cancel_buf;
  arg_01 = &__cancel_buf;
  uVar8 = 0;
  prctl(0xf,"libkqueue_mon",0,0,0);
  nb_max_fd = get_fd_limit();
  sigemptyset((sigset_t *)&monitoring_sig_set);
  sigfillset((sigset_t *)&monitoring_sig_set);
  pthread_sigmask(0,(sigset_t *)&monitoring_sig_set,(__sigset_t *)0x0);
  sigemptyset((sigset_t *)&monitoring_sig_set);
  iVar4 = __libc_current_sigrtmin();
  sigaddset((sigset_t *)&monitoring_sig_set,iVar4 + 1);
  lVar5 = syscall(0xba);
  iVar4 = nb_max_fd;
  monitoring_tid = (pid_t)lVar5;
  __nmemb = (size_t)nb_max_fd;
  __ptr = (int *)calloc(__nmemb,4);
  fd_map = __ptr;
  if (__ptr != (int *)0x0) {
    uVar7 = uVar8;
    if (0 < iVar4) {
      uVar7 = (ulong)(uint)iVar4;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      __ptr[uVar8] = -1;
    }
    fd_use_cnt = (uint *)calloc(__nmemb,4);
    if (fd_use_cnt == (uint *)0x0) {
      free(__ptr);
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&monitoring_thread_mtx);
      pthread_cond_signal((pthread_cond_t *)&monitoring_thread_cond);
      pthread_mutex_unlock((pthread_mutex_t *)&monitoring_thread_mtx);
      monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_UNLOCKED;
      iVar4 = __sigsetjmp(&__cancel_buf,0);
      if (iVar4 != 0) {
        monitoring_thread_cleanup(arg_00);
        __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_buf);
        if (monitoring_thread_state - THREAD_EXIT_STATE_CANCEL_LOCKED < 2) {
          kVar1 = kq_list;
          if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED) {
            pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
            kVar1 = kq_list;
          }
          while (pkVar6 = kVar1.lh_first, pkVar6 != (kqueue *)0x0) {
            kVar1.lh_first = (pkVar6->kq_entry).le_next;
            iVar4 = fcntl(pkVar6->kq_id,1);
            puVar2 = fd_use_cnt;
            if (iVar4 < 0) {
              fd_use_cnt[pkVar6->kq_id] = 0;
            }
            if (puVar2[pkVar6->kq_id] == 0) {
              kqueue_free(pkVar6);
            }
          }
          if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED) {
            pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
          }
        }
        tVar3 = monitoring_thread_state;
        free(fd_map);
        fd_map = (int *)0x0;
        free(fd_use_cnt);
        fd_use_cnt = (uint *)0x0;
        monitoring_tid = 0;
        if (tVar3 != THREAD_EXIT_STATE_CANCEL_LOCKED) {
          return extraout_RAX;
        }
        iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
        return (void *)CONCAT44(extraout_var,iVar4);
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
      while( true ) {
        do {
          iVar4 = sigwaitinfo((sigset_t *)&monitoring_sig_set,(siginfo_t *)&info);
        } while (iVar4 == -1);
        pthread_setcancelstate(1,(int *)0x0);
        pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
        if (((-1 < fd_map[info._sifields._pad[2]]) &&
            (pkVar6 = kqueue_lookup(fd_map[info._sifields._pad[2]]), puVar2 = fd_use_cnt,
            pkVar6 != (kqueue *)0x0)) &&
           (fd_use_cnt[pkVar6->kq_id] = fd_use_cnt[pkVar6->kq_id] - 1, puVar2[pkVar6->kq_id] == 0))
        {
          kqueue_free(pkVar6);
        }
        if (kq_cnt == 0) break;
        pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
        pthread_setcancelstate(0,(int *)0x0);
      }
      monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_LOCKED;
      pthread_setcancelstate(0,(int *)0x0);
      pthread_testcancel();
      monitoring_thread_state = THREAD_EXIT_STATE_SELF_CANCEL;
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
      monitoring_thread_cleanup(arg_01);
      __th = pthread_self();
      pthread_detach(__th);
      pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
monitoring_thread_loop(UNUSED void *arg)
{
    int res = 0;
    siginfo_t info;

    int i;

    sigset_t monitoring_sig_set;

    /* Set the thread's name to something descriptive so it shows up in gdb,
     * etc. glibc >= 2.1.2 supports pthread_setname_np, but this is a safer way
     * to do it for backwards compatibility. Max name length is 16 bytes. */
    prctl(PR_SET_NAME, "libkqueue_mon", 0, 0, 0);

    nb_max_fd = get_fd_limit();

    sigemptyset(&monitoring_sig_set);
    sigfillset(&monitoring_sig_set);

    pthread_sigmask(SIG_BLOCK, &monitoring_sig_set, NULL);

    sigemptyset(&monitoring_sig_set);
    sigaddset(&monitoring_sig_set, MONITORING_THREAD_SIGNAL);

    monitoring_tid = syscall(SYS_gettid);

    dbg_printf("tid=%u - monitoring thread started", monitoring_tid);

    fd_map = calloc(nb_max_fd, sizeof(int));
    if (fd_map == NULL) {
    error:
        return NULL;
    }
    for (i = 0; i < nb_max_fd; i++)
        fd_map[i] = -1;

    fd_use_cnt = calloc(nb_max_fd, sizeof(unsigned int));
    if (fd_use_cnt == NULL){
        free(fd_map);
        goto error;
    }

    /*
     * Now that thread is initialized, let kqueue init resume
     */
    pthread_mutex_lock(&monitoring_thread_mtx);    /* Must try to lock to ensure parent is waiting on signal */
    pthread_cond_signal(&monitoring_thread_cond);
    pthread_mutex_unlock(&monitoring_thread_mtx);

    monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_UNLOCKED;
    pthread_cleanup_push(monitoring_thread_cleanup, NULL)
    while (true) {
        /*
         * Wait for signal notifying us that a change has occured on the pipe
         * It's not possible to only listen on FD close but no other operation
         * should be performed on the kqueue.
         */
        res = sigwaitinfo(&monitoring_sig_set, &info);
        if (res == -1) {
            dbg_printf("sigwaitinfo(2): %s", strerror(errno));
            continue;
        }

        /*
         * Don't allow cancellation in the middle of cleaning up resources
         */
        pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
        tracing_mutex_lock(&kq_mtx);
        dbg_printf("fd=%i - freeing kqueue due to fd closure (signal) for sfd=%i ", fd_map[info.si_fd], info.si_fd);

        /*
         * Release resources used by this kqueue
         */
        monitoring_thread_kqueue_cleanup(info.si_fd);

        /*
         * Exit if there are no more kqueues to monitor
         */
        if (kq_cnt == 0)
            break;

        tracing_mutex_unlock(&kq_mtx);
        pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
    }

    /*
     * Ensure that any cancellation requests are acted on
     */
    monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_LOCKED;
    pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
    pthread_testcancel();

    monitoring_thread_state = THREAD_EXIT_STATE_SELF_CANCEL;
    pthread_cleanup_pop(true); /* Executes the cleanup function (monitoring_thread_cleanup) */
    res = pthread_detach(pthread_self());
    if (res != 0)
        dbg_printf("pthread_detach(3): %s", strerror(res));
    tracing_mutex_unlock(&kq_mtx);

    return NULL;
}